

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O3

bool anon_unknown.dwarf_180d15f::isSameEnum(Expression *expr,Type *enumType)

{
  ExpressionKind EVar1;
  bool bVar2;
  ConditionalExpression *cond;
  
  EVar1 = expr->kind;
  while( true ) {
    if (EVar1 != ConditionalOp) {
      bVar2 = slang::ast::Type::isMatching(*(Type **)((long)expr + 8),enumType);
      return bVar2;
    }
    bVar2 = isSameEnum((Expression *)((Expression *)((long)expr + 0x30))->syntax,enumType);
    if (!bVar2) break;
    expr = *(Expression **)&(((Expression *)((long)expr + 0x30))->sourceRange).startLoc;
    EVar1 = expr->kind;
  }
  return false;
}

Assistant:

bool isSameEnum(const Expression& expr, const Type& enumType) {
    if (expr.kind == ExpressionKind::ConditionalOp) {
        auto& cond = expr.as<ConditionalExpression>();
        return isSameEnum(cond.left(), enumType) && isSameEnum(cond.right(), enumType);
    }
    return expr.type->isMatching(enumType);
}